

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_ManComputeRefs(Jf_Man_t *p)

{
  float *pfVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Obj_t *pObj;
  int *piVar9;
  Jf_Par_t *pJVar10;
  long lVar11;
  int iVar12;
  Gia_Man_t *pGVar13;
  uint *c;
  int i;
  uint i_00;
  ulong uVar14;
  float fVar15;
  
  piVar9 = p->pGia->pRefs;
  if (piVar9 == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x522,"int Jf_ManComputeRefs(Jf_Man_t *)");
  }
  pfVar3 = (p->vRefs).pArray;
  pfVar4 = (p->vFlow).pArray;
  memset(piVar9,0,(long)p->pGia->nObjs << 2);
  pJVar10 = p->pPars;
  pJVar10->Area = 0;
  pJVar10->Edge = 0;
  pGVar13 = p->pGia;
  iVar12 = pGVar13->nObjs;
  do {
    if (iVar12 < 1) {
LAB_005ec51b:
      iVar12 = pGVar13->nObjs;
      lVar11 = 0;
      do {
        if (iVar12 <= lVar11) {
          iVar12 = Jf_ManComputeDelay(p,1);
          pJVar10 = p->pPars;
          pJVar10->Delay = (long)iVar12;
          return (int)pJVar10->Area;
        }
        fVar2 = pfVar3[lVar11];
        fVar15 = 0.2;
        fVar5 = 0.8;
        if (p->pPars->fOptEdge != 0) {
          fVar5 = fVar15;
          fVar15 = 0.8;
        }
        fVar5 = fVar2 * fVar15 + (float)pGVar13->pRefs[lVar11] * fVar5;
        fVar15 = 1.0;
        if (1.0 <= fVar5) {
          fVar15 = fVar5;
        }
        pfVar4[lVar11] = (fVar2 * pfVar4[lVar11]) / fVar15;
        pfVar3[lVar11] = fVar15;
        pfVar1 = pfVar4 + lVar11;
        lVar11 = lVar11 + 1;
      } while (0.0 <= *pfVar1);
      __assert_fail("pFlow[i] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                    ,0x53d,"int Jf_ManComputeRefs(Jf_Man_t *)");
    }
    iVar12 = iVar12 + -1;
    pObj = Gia_ManObj(pGVar13,iVar12);
    if (pObj == (Gia_Obj_t *)0x0) {
      pGVar13 = p->pGia;
      goto LAB_005ec51b;
    }
    iVar7 = (int)*(ulong *)pObj;
    uVar14 = *(ulong *)pObj & 0x1fffffff;
    if ((iVar7 < 0 && uVar14 != 0x1fffffff) || (iVar6 = Gia_ObjIsBuf(pObj), iVar6 != 0)) {
      Gia_ObjRefInc(p->pGia,pObj + -uVar14);
    }
    else if ((-1 < iVar7 && (int)uVar14 != 0x1fffffff) &&
            (iVar7 = Gia_ObjRefNum(p->pGia,pObj), 0 < iVar7)) {
      if ((pObj->field_0x3 & 0x40) != 0) {
        __assert_fail("Jf_ObjIsUnit(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x52b,"int Jf_ManComputeRefs(Jf_Man_t *)");
      }
      piVar9 = Jf_ObjCuts(p,iVar12);
      c = (uint *)(piVar9 + 1);
      for (i_00 = 1; uVar8 = *c & 0xf, i_00 <= uVar8; i_00 = i_00 + 1) {
        pGVar13 = p->pGia;
        uVar8 = Jf_CutVar((int *)c,i_00);
        piVar9 = pGVar13->pRefs + uVar8;
        *piVar9 = *piVar9 + 1;
      }
      pJVar10 = p->pPars;
      if (pJVar10->fGenCnf != 0) {
        iVar7 = Jf_CutCnfSize(p,(int *)c);
        pJVar10 = p->pPars;
        pJVar10->Clause = pJVar10->Clause + (long)iVar7;
        uVar8 = *c & 0xf;
      }
      pJVar10->Area = pJVar10->Area + 1;
      pJVar10->Edge = (ulong)uVar8 + pJVar10->Edge;
    }
    pGVar13 = p->pGia;
  } while( true );
}

Assistant:

int Jf_ManComputeRefs( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vFlow);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            pCut = Jf_ObjCutBest(p, i);
            Jf_CutRef( p, pCut );
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, pCut);
            p->pPars->Edge += Jf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}